

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runsv.c
# Opt level: O2

uint custom(svdir *s,char c)

{
  int iVar1;
  __pid_t pid;
  int *piVar2;
  char *m1;
  int w;
  char a [10];
  char *prog [2];
  stat st;
  
  if (s->islog != 0) {
    return 0;
  }
  byte_copy(a,10,"control/?");
  a[8] = c;
  iVar1 = stat(a,(stat *)&st);
  if (iVar1 == 0) {
    if (((byte)st.st_mode & 0x40) == 0) {
      return 0;
    }
    pid = fork();
    if (pid == 0) {
      if ((haslog != 0) && (iVar1 = fd_copy(1,logpipe[1]), iVar1 == -1)) {
        warn2("unable to setup stdout for ",a);
      }
      prog[1] = (char *)0x0;
      prog[0] = a;
      execve(a,prog,_environ);
      fatal("unable to run control/?");
    }
    else if (pid == -1) {
      m1 = "unable to fork for ";
      goto LAB_00102859;
    }
    do {
      iVar1 = wait_pid(&w,pid);
      if (iVar1 != -1) {
        return (uint)((uint)w < 0x100);
      }
      piVar2 = __errno_location();
    } while (*piVar2 == error_intr);
    warn2("unable to wait for child ",a);
  }
  else {
    piVar2 = __errno_location();
    if (*piVar2 == error_noent) {
      return 0;
    }
    m1 = "unable to stat ";
LAB_00102859:
    warn2(m1,a);
  }
  return 0;
}

Assistant:

unsigned int custom(struct svdir *s, char c) {
  int pid;
  int w;
  char a[10];
  struct stat st;
  char *prog[2];

  if (s->islog) return(0);
  byte_copy(a, 10, "control/?");
  a[8] =c;
  if (stat(a, &st) == 0) {
    if (st.st_mode & S_IXUSR) {
      if ((pid =fork()) == -1) {
        warn2("unable to fork for ", a);
        return(0);
      }
      if (! pid) {
        if (haslog && fd_copy(1, logpipe[1]) == -1)
          warn2("unable to setup stdout for ", a);
        prog[0] =a;
        prog[1] =0;
        execve(a, prog, environ);
        fatal("unable to run control/?");
      }
      while (wait_pid(&w, pid) == -1) {
        if (errno == error_intr) continue;
        warn2("unable to wait for child ", a);
        return(0);
      }
      return(! wait_exitcode(w));
    }
  }
  else {
    if (errno == error_noent) return(0);
    warn2("unable to stat ", a);
  }
  return(0);
}